

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_convert.c
# Opt level: O2

int mpt_value_convert(mpt_value *val,mpt_type_t type,void *dest)

{
  undefined8 *__src;
  mpt_type_t type_00;
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  mpt_data_converter_t p_Var4;
  mpt_type_traits *pmVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  void *src;
  
  __src = (undefined8 *)val->_addr;
  iVar8 = -1;
  if (type != 0) {
    src = __src;
    p_Var4 = mpt_data_converter(val->_type);
    if ((p_Var4 != (mpt_data_converter_t)0x0) && (iVar2 = (*p_Var4)(__src,type,dest), -1 < iVar2)) {
      return (uint)(val->_type != type) * 3;
    }
    type_00 = val->_type;
    if (type_00 == type) {
      pmVar5 = mpt_type_traits(type);
      if (((pmVar5 != (mpt_type_traits *)0x0) &&
          (iVar8 = -2, pmVar5->init == (_func_int_void_ptr_void_ptr *)0x0)) &&
         ((pmVar5->fini == (_func_void_void_ptr *)0x0 && (iVar8 = 0, dest != (void *)0x0)))) {
        memcpy(dest,__src,pmVar5->size);
      }
    }
    else {
      if (type == 0x40) {
        uVar3 = 0;
        if (type_00 - 0x40 < 0x1a) {
          uVar3 = (int)type_00 + 0x20;
        }
        if (0 < (int)uVar3) {
          pmVar5 = mpt_type_traits((ulong)uVar3);
          if (pmVar5 == (mpt_type_traits *)0x0) {
            return -1;
          }
          if (pmVar5->init != (_func_int_void_ptr_void_ptr *)0x0) {
            return -2;
          }
          if (pmVar5->fini != (_func_void_void_ptr *)0x0) {
            return -2;
          }
          if (dest == (void *)0x0) {
            return 1;
          }
          uVar1 = __src[1];
          *(undefined8 *)dest = *__src;
          *(undefined8 *)((long)dest + 8) = uVar1;
          return 1;
        }
      }
      uVar7 = 0;
      if (type_00 - 0x60 < 0x1b) {
        uVar7 = (ulong)((int)type_00 + 0xe0U & 0xff);
      }
      if (uVar7 == type) {
        pmVar5 = mpt_type_traits(type_00);
        if ((pmVar5 != (mpt_type_traits *)0x0) && (iVar8 = 2, dest != (void *)0x0)) {
          *(undefined8 **)dest = __src;
          *(size_t *)((long)dest + 8) = pmVar5->size;
        }
      }
      else {
        iVar8 = -3;
        if (((type == 0x73) &&
            (pcVar6 = mpt_data_tostring(&src,type_00,(size_t *)0x0), pcVar6 != (char *)0x0)) &&
           (iVar8 = 4, dest != (void *)0x0)) {
          *(char **)dest = pcVar6;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

extern int mpt_value_convert(const MPT_STRUCT(value) *val, MPT_TYPE(type) type, void *dest)
{
	MPT_TYPE(data_converter) conv;
	const void *src = val->_addr;
	int ret;
	
	if (!type) {
		return MPT_ERROR(BadArgument);
	}
	/* try specialized converter for type */
	if ((conv = mpt_data_converter(val->_type))) {
		if ((ret = conv(src, type, dest)) >= 0) {
			return val->_type == type ? 0 : 3;
		}
	}
	/* exact primitive type match */
	if (val->_type == type) {
		const MPT_STRUCT(type_traits) *traits;
		if (!(traits = mpt_type_traits(type))) {
			return MPT_ERROR(BadArgument);
		}
		/* no raw copy for complex types */
		if (traits->init || traits->fini) {
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			memcpy(dest, src, traits->size);
		}
		return 0;
	}
	/* vector source and genric target */
	if (type == MPT_ENUM(TypeVector)
	 && ((ret = MPT_type_toScalar(val->_type)) > 0)) {
		const MPT_STRUCT(type_traits) *traits;
		if (!(traits = mpt_type_traits(ret))) {
			return MPT_ERROR(BadArgument);
		}
		/* content of generic vector must be primitive */
		if (traits->init || traits->fini) {
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			memcpy(dest, src, sizeof(struct iovec));
		}
		return 1;
	}
	/* map to vector of same type with single element */
	if (type == MPT_type_toVector(val->_type)) {
		const MPT_STRUCT(type_traits) *traits;
		struct iovec *vec;
		if (!(traits = mpt_type_traits(val->_type))) {
			return MPT_ERROR(BadArgument);
		}
		/* convert from scalar */
		if ((vec = dest)) {
			vec->iov_base = (void *) src;
			vec->iov_len = traits->size;
		}
		return 2;
	}
	/* value represents valid string data */
	if (type == 's') {
		const char *str;
		if ((str = mpt_data_tostring(&src, val->_type, 0))) {
			if (dest) {
				*((const char **) dest) = str;
			}
			return 4;
		}
	}
	return MPT_ERROR(BadType);
}